

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O1

void __thiscall
bssl::gtest_suite_PkitsTest14DistributionPoints_::
Section14ValidcRLIssuerTest30<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::TestBody
          (Section14ValidcRLIssuerTest30<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  PkitsTestInfo *in_RCX;
  PkitsTestInfo info;
  PkitsTestInfo local_88;
  
  PkitsTestInfo::PkitsTestInfo(&local_88);
  local_88.test_number = "4.14.30";
  local_88.should_validate = true;
  PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::RunTest<4ul,2ul>
            ((PkitsTest<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate> *)
             &PTR_anon_var_dwarf_3fc32f_006d1630,(char *(*) [4])&PTR_anon_var_dwarf_3fc361_006d1650,
             &local_88.test_number,in_RCX);
  PkitsTestInfo::~PkitsTestInfo(&local_88);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest14DistributionPoints,
                     Section14ValidcRLIssuerTest30) {
  const char* const certs[] = {
      "TrustAnchorRootCertificate", "indirectCRLCA4Cert",
      "indirectCRLCA4cRLIssuerCert", "ValidcRLIssuerTest30EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "indirectCRLCA4cRLIssuerCRL"};
  PkitsTestInfo info;
  info.test_number = "4.14.30";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}